

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O3

int pigpio_start(char *addrStr,char *portStr)

{
  int iVar1;
  undefined4 uVar2;
  ssize_t sVar3;
  int *userdata;
  pthread_t *ppVar4;
  int iVar5;
  pthread_t **pppVar6;
  long lVar7;
  pthread_mutex_t *__mutex;
  int cancelState;
  undefined8 local_58;
  undefined8 uStack_50;
  char *local_40;
  int local_34;
  
  pppVar6 = gPthNotify;
  __mutex = gCmdMutex;
  iVar5 = 0;
  lVar7 = 0;
  while (*(int *)((long)gPiInUse + lVar7) != 0) {
    pppVar6 = pppVar6 + 1;
    lVar7 = lVar7 + 4;
    __mutex = __mutex + 1;
    iVar5 = iVar5 + 1;
    if (lVar7 == 0x80) {
      return -0x7dc;
    }
  }
  *(undefined4 *)((long)gPiInUse + lVar7) = 1;
  if (((addrStr == (char *)0x0) || (*addrStr == '\0')) &&
     ((addrStr = getenv("PIGPIO_ADDR"), addrStr == (char *)0x0 || (*addrStr == '\0')))) {
    addrStr = "localhost";
  }
  if (((portStr == (char *)0x0) || (*portStr == '\0')) &&
     ((portStr = getenv("PIGPIO_PORT"), portStr == (char *)0x0 || (*portStr == '\0')))) {
    portStr = "8888";
  }
  pthread_mutex_init((pthread_mutex_t *)__mutex,(pthread_mutexattr_t *)0x0);
  local_40 = portStr;
  iVar1 = pigpioOpenSocket(addrStr,portStr);
  *(int *)((long)gPigCommand + lVar7) = iVar1;
  if (iVar1 < 0) {
    return iVar1;
  }
  iVar1 = pigpioOpenSocket(addrStr,local_40);
  *(int *)((long)gPigNotify + lVar7) = iVar1;
  if (iVar1 < 0) {
    return iVar1;
  }
  if (*(int *)((long)gPiInUse + lVar7) == 0) {
    uVar2 = 0xfffff825;
  }
  else {
    local_58 = 99;
    uStack_50 = 0;
    pthread_setcancelstate(1,&local_34);
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
    *(int *)((long)gCancelState + lVar7) = local_34;
    sVar3 = send(*(int *)((long)gPigNotify + lVar7),&local_58,0x10,0);
    if (sVar3 == 0x10) {
      sVar3 = recv(*(int *)((long)gPigNotify + lVar7),&local_58,0x10,0x100);
      iVar1 = *(int *)((long)gCancelState + lVar7);
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      pthread_setcancelstate(iVar1,(int *)0x0);
      uVar2 = 0xfffff82f;
      if (sVar3 == 0x10) {
        *(undefined4 *)((long)gPigHandle + lVar7) = uStack_50._4_4_;
        if (uStack_50 < 0) {
          return -0x7d5;
        }
        iVar1 = pigpio_command(iVar5,10,0,0,1);
        *(int *)((long)gLastLevel + lVar7) = iVar1;
        userdata = (int *)malloc(4);
        *userdata = iVar5;
        ppVar4 = start_thread(pthNotifyThread,userdata);
        *pppVar6 = ppVar4;
        if (ppVar4 != (pthread_t *)0x0) {
          return iVar5;
        }
        return -0x7d9;
      }
    }
    else {
      iVar5 = *(int *)((long)gCancelState + lVar7);
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      pthread_setcancelstate(iVar5,(int *)0x0);
      uVar2 = 0xfffff830;
    }
  }
  *(undefined4 *)((long)gPigHandle + lVar7) = uVar2;
  return -0x7d5;
}

Assistant:

int pigpio_start(char *addrStr, char *portStr)
{
   int pi;
   int *userdata;

   for (pi=0; pi<MAX_PI; pi++)
   {
      if (!gPiInUse[pi]) break;
   }

   if (pi >= MAX_PI) return pigif_too_many_pis;

   gPiInUse[pi] = 1;

   if ((!addrStr)  || (!strlen(addrStr)))
   {
      addrStr = getenv(PI_ENVADDR);

      if ((!addrStr) || (!strlen(addrStr)))
      {
         addrStr = PI_DEFAULT_SOCKET_ADDR_STR;
      }
   }

   if ((!portStr) || (!strlen(portStr)))
   {
      portStr = getenv(PI_ENVPORT);

      if ((!portStr) || (!strlen(portStr)))
      {
         portStr = PI_DEFAULT_SOCKET_PORT_STR;
      }
   }

   pthread_mutex_init(&gCmdMutex[pi], NULL);

   gPigCommand[pi] = pigpioOpenSocket(addrStr, portStr);

   if (gPigCommand[pi] >= 0)
   {
      gPigNotify[pi] = pigpioOpenSocket(addrStr, portStr);

      if (gPigNotify[pi] >= 0)
      {
         gPigHandle[pi] = pigpio_notify(pi);

         if (gPigHandle[pi] < 0) return pigif_bad_noib;
         else
         {
            gLastLevel[pi] = read_bank_1(pi);

            /* must be freed by pthNotifyThread */
            userdata = malloc(sizeof(*userdata));
            *userdata = pi;

            gPthNotify[pi] = start_thread(pthNotifyThread, userdata);

            if (gPthNotify[pi]) return pi;
            else                return pigif_notify_failed;

         }
      }
      else return gPigNotify[pi];
   }
   else return gPigCommand[pi];
}